

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covCore.c
# Opt level: O1

Min_Cube_t *
Abc_NodeCovProduct(Cov_Man_t *p,Min_Cube_t *pCover0,Min_Cube_t *pCover1,int fEsop,int nSupp)

{
  int iVar1;
  Min_Man_t *pMVar2;
  Min_Cube_t **ppMVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  Min_Cube_t *pMVar8;
  Min_Cube_t *pMVar9;
  Min_Cube_t *pMVar10;
  Min_Cube_t *pMVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  
  if ((pCover0 == (Min_Cube_t *)0x0) || (pCover1 == (Min_Cube_t *)0x0)) {
    __assert_fail("pCover0 && pCover1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covCore.c"
                  ,0x1da,
                  "Min_Cube_t *Abc_NodeCovProduct(Cov_Man_t *, Min_Cube_t *, Min_Cube_t *, int, int)"
                 );
  }
  Min_ManClean(p->pManMin,nSupp);
  pMVar10 = pCover1;
  do {
    uVar7 = (ulong)p->vPairs0->nSize;
    bVar14 = 0 < (long)uVar7;
    if (0 < (long)uVar7) {
      uVar13 = 1;
      do {
        iVar6 = p->vPairs0->pArray[uVar13 - 1];
        iVar1 = p->vPairs1->pArray[uVar13 - 1];
        if ((pMVar10->uData[iVar1 >> 4] >> ((char)iVar1 * '\x02' & 0x1fU) &
             pCover0->uData[iVar6 >> 4] >> ((char)iVar6 * '\x02' & 0x1fU) & 3) == 0) {
          if (bVar14) goto LAB_00449dac;
          break;
        }
        bVar14 = uVar13 < uVar7;
        bVar15 = uVar13 != uVar7;
        uVar13 = uVar13 + 1;
      } while (bVar15);
    }
    pMVar2 = p->pManMin;
    if (p->nCubesMax < pMVar2->nCubes) {
      pMVar10 = Min_CoverCollect(pMVar2,nSupp);
      if (pMVar10 != (Min_Cube_t *)0x0) {
        pMVar2 = p->pManMin;
        pMVar8 = pMVar10->pNext;
        while (pMVar9 = pMVar8, Extra_MmFixedEntryRecycle(pMVar2->pMemMan,(char *)pMVar10),
              pMVar9 != (Min_Cube_t *)0x0) {
          pMVar10 = pMVar9;
          pMVar8 = pMVar9->pNext;
        }
        return (Min_Cube_t *)0x0;
      }
      goto LAB_00449e91;
    }
    pMVar8 = (Min_Cube_t *)Extra_MmFixedEntryFetch(pMVar2->pMemMan);
    pMVar8->pNext = (Min_Cube_t *)0x0;
    uVar5 = pMVar2->nVars & 0x3ff;
    *(uint *)&pMVar8->field_0x8 = *(uint *)&pMVar8->field_0x8 & 0xfffffc00 | uVar5;
    uVar5 = (pMVar2->nWords & 0xfffU) << 10 | uVar5;
    *(uint *)&pMVar8->field_0x8 = uVar5;
    memset(pMVar8->uData,0xff,(long)pMVar2->nWords << 2);
    *(uint *)&pMVar8->field_0x8 = uVar5;
    if (0 < nSupp) {
      bVar4 = 0;
      uVar7 = 0;
      do {
        iVar6 = p->vComTo0->pArray[uVar7];
        uVar5 = 3;
        uVar12 = 3;
        if (iVar6 != -1) {
          uVar12 = pCover0->uData[iVar6 >> 4] >> ((char)iVar6 * '\x02' & 0x1fU) & 3;
        }
        iVar6 = p->vComTo1->pArray[uVar7];
        if (iVar6 != -1) {
          uVar5 = pMVar10->uData[iVar6 >> 4] >> ((char)iVar6 * '\x02' & 0x1fU);
        }
        if ((uVar5 & uVar12) != 3) {
          pMVar8->uData[uVar7 >> 4 & 0xfffffff] =
               pMVar8->uData[uVar7 >> 4 & 0xfffffff] ^ (uVar5 & uVar12 ^ 3) << (bVar4 & 0x1e);
          *(int *)&pMVar8->field_0x8 = *(int *)&pMVar8->field_0x8 + 0x400000;
        }
        uVar7 = uVar7 + 1;
        bVar4 = bVar4 + 2;
      } while ((uint)nSupp != uVar7);
    }
    if (fEsop == 0) {
      Min_SopAddCube(p->pManMin,pMVar8);
    }
    else {
      Min_EsopAddCube(p->pManMin,pMVar8);
    }
LAB_00449dac:
    ppMVar3 = &pMVar10->pNext;
    pMVar10 = *ppMVar3;
    if ((*ppMVar3 == (Min_Cube_t *)0x0) &&
       (pCover0 = pCover0->pNext, pMVar10 = pCover1, pCover0 == (Min_Cube_t *)0x0)) {
      if (fEsop == 0) {
        Min_SopMinimize(p->pManMin);
      }
      else {
        Min_EsopMinimize(p->pManMin);
      }
      pMVar10 = Min_CoverCollect(p->pManMin,nSupp);
      if (pMVar10 == (Min_Cube_t *)0x0) {
        iVar6 = 0;
      }
      else {
        iVar6 = 0;
        pMVar8 = pMVar10;
        do {
          iVar6 = iVar6 + 1;
          pMVar8 = pMVar8->pNext;
        } while (pMVar8 != (Min_Cube_t *)0x0);
      }
      pMVar8 = pMVar10;
      if (p->nFaninMax < iVar6) {
        if (pMVar10 == (Min_Cube_t *)0x0) {
LAB_00449e91:
          pMVar8 = (Min_Cube_t *)0x0;
        }
        else {
          pMVar2 = p->pManMin;
          pMVar8 = (Min_Cube_t *)0x0;
          pMVar9 = pMVar10->pNext;
          while (pMVar11 = pMVar9, Extra_MmFixedEntryRecycle(pMVar2->pMemMan,(char *)pMVar10),
                pMVar11 != (Min_Cube_t *)0x0) {
            pMVar10 = pMVar11;
            pMVar9 = pMVar11->pNext;
          }
        }
      }
      return pMVar8;
    }
  } while( true );
}

Assistant:

Min_Cube_t * Abc_NodeCovProduct( Cov_Man_t * p, Min_Cube_t * pCover0, Min_Cube_t * pCover1, int fEsop, int nSupp )
{
    Min_Cube_t * pCube, * pCube0, * pCube1;
    Min_Cube_t * pCover;
    int i, Val0, Val1;
    assert( pCover0 && pCover1 );

    // clean storage
    Min_ManClean( p->pManMin, nSupp );
    // go through the cube pairs
    Min_CoverForEachCube( pCover0, pCube0 )
    Min_CoverForEachCube( pCover1, pCube1 )
    {
        // go through the support variables of the cubes
        for ( i = 0; i < p->vPairs0->nSize; i++ )
        {
            Val0 = Min_CubeGetVar( pCube0, p->vPairs0->pArray[i] );
            Val1 = Min_CubeGetVar( pCube1, p->vPairs1->pArray[i] );
            if ( (Val0 & Val1) == 0 )
                break;
        }
        // check disjointness
        if ( i < p->vPairs0->nSize )
            continue;

        if ( p->pManMin->nCubes > p->nCubesMax )
        {
            pCover = Min_CoverCollect( p->pManMin, nSupp );
//Min_CoverWriteFile( pCover, "large", 1 );
            Min_CoverRecycle( p->pManMin, pCover );
            return NULL;
        }

        // create the product cube
        pCube = Min_CubeAlloc( p->pManMin );

        // add the literals
        pCube->nLits = 0;
        for ( i = 0; i < nSupp; i++ )
        {
            if ( p->vComTo0->pArray[i] == -1 )
                Val0 = 3;
            else
                Val0 = Min_CubeGetVar( pCube0, p->vComTo0->pArray[i] );

            if ( p->vComTo1->pArray[i] == -1 )
                Val1 = 3;
            else
                Val1 = Min_CubeGetVar( pCube1, p->vComTo1->pArray[i] );

            if ( (Val0 & Val1) == 3 )
                continue;

            Min_CubeXorVar( pCube, i, (Val0 & Val1) ^ 3 );
            pCube->nLits++;
        }
        // add the cube to storage
        if ( fEsop ) 
            Min_EsopAddCube( p->pManMin, pCube );
        else
            Min_SopAddCube( p->pManMin, pCube );
    }

    // minimize the cover
    if ( fEsop ) 
        Min_EsopMinimize( p->pManMin );
    else
        Min_SopMinimize( p->pManMin );
    pCover = Min_CoverCollect( p->pManMin, nSupp );

    // quit if the cover is too large
    if ( Min_CoverCountCubes(pCover) > p->nFaninMax )
    {
/*        
Min_CoverWriteFile( pCover, "large", 1 );
        Min_CoverExpand( p->pManMin, pCover );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        pCover = Min_CoverCollect( p->pManMin, nSupp );
*/
        Min_CoverRecycle( p->pManMin, pCover );
        return NULL;
    }
    return pCover;
}